

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNode * __thiscall Parser::call(Parser *this,Token *id)

{
  pointer ppEVar1;
  Testlist *pTVar2;
  CallExpr *this_00;
  undefined8 extraout_RAX;
  int i;
  long lVar3;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> newArray;
  Token closeParen;
  Token openParen;
  allocator<char> local_23a;
  allocator<char> local_239;
  _Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_> local_238;
  _Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_> local_218;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  Token local_180;
  Token local_110;
  Token local_a0;
  
  Tokenizer::getToken(&local_a0,this->tokenizer);
  if (local_a0._symbol == '(') {
    pTVar2 = testList(this);
    local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar3 = 0;
        ppEVar1 = (pTVar2->_list).super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        lVar3 < (int)((ulong)((long)(pTVar2->_list).
                                    super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3)
        ; lVar3 = lVar3 + 1) {
      local_180._name._M_dataplus._M_p = (pointer)ppEVar1[lVar3];
      std::vector<ExprNode*,std::allocator<ExprNode*>>::emplace_back<ExprNode*>
                ((vector<ExprNode*,std::allocator<ExprNode*>> *)&local_238,(ExprNode **)&local_180);
    }
    Tokenizer::getToken(&local_180,this->tokenizer);
    if (local_180._symbol == ')') {
      this_00 = (CallExpr *)operator_new(0xa0);
      Token::Token(&local_110,id);
      std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector
                ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&local_218,
                 (vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&local_238);
      CallExpr::CallExpr(this_00,&local_110,
                         (vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&local_218);
      std::_Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>::~_Vector_base(&local_218);
      Token::~Token(&local_110);
      Token::~Token(&local_180);
      std::_Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>::~_Vector_base(&local_238);
      Token::~Token(&local_a0);
      return &this_00->super_ExprNode;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Parser::callStmt",(allocator<char> *)&local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"Expected an ( sign, instead got",(allocator<char> *)&local_238)
    ;
    die(this,&local_1a0,&local_1c0,&local_a0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"Parser::callStmt",&local_239);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"Expected an ) sign, instead got",&local_23a);
  die(this,&local_1e0,&local_200,&local_180);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  Token::~Token(&local_180);
  std::_Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>::~_Vector_base(&local_238);
  Token::~Token(&local_a0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ExprNode *Parser::call(Token id) {
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::callStmt", "Expected an ( sign, instead got", openParen);
    Testlist *callTestlist = testList();
    std::vector<ExprNode*>newArray;
    for(int i = 0; i < callTestlist->numTests();i++){
        newArray.push_back(callTestlist->at(i));
    }
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::callStmt", "Expected an ) sign, instead got", closeParen);
//    CallStatement *callStatement = new CallStatement(id.getName(), callTestlist);
    auto *callExpr = new CallExpr(id, newArray);

    return callExpr;
    //CallExpr *callExpr = new CallExpr()
    //callToken.setWholeNumber(callStatement->evaluate());
    //return new WholeNumber(callToken);

}